

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O2

void LLVMConsumeError(LLVMErrorRef Err)

{
  Error local_18;
  
  local_18.Payload = (ErrorInfoBase *)((ulong)Err | 1);
  llvm::consumeError(&local_18);
  if ((long *)((ulong)local_18.Payload & 0xfffffffffffffffe) != (long *)0x0) {
    (**(code **)(*(long *)((ulong)local_18.Payload & 0xfffffffffffffffe) + 8))();
  }
  return;
}

Assistant:

void LLVMConsumeError(LLVMErrorRef Err) { consumeError(unwrap(Err)); }